

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::NextLetConstGlobal
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,int *index,
          RootObjectBase *instance,PropertyRecord **propertyRecord,Var *value,bool *isConst)

{
  byte bVar1;
  int iVar2;
  SimpleDictionaryPropertyDescriptor<int> *pSVar3;
  PropertyRecord **ppPVar4;
  Var pvVar5;
  bool bVar6;
  int iVar7;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  
  iVar7 = *index;
  this_00 = (this->propertyMap).ptr;
  iVar2 = this_00->count - this_00->freeCount;
  bVar6 = iVar7 < iVar2;
  if (iVar7 < iVar2) {
    do {
      pSVar3 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,iVar7);
      bVar1 = pSVar3->Attributes;
      if ((bVar1 & 0x10) != 0) {
        iVar7 = pSVar3->propertyIndex;
        ppPVar4 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,*index);
        *propertyRecord = *ppPVar4;
        pvVar5 = DynamicObject::GetSlot(&instance->super_DynamicObject,iVar7);
        *value = pvVar5;
        *isConst = (bool)(bVar1 >> 7);
        *index = *index + 1;
        return bVar6;
      }
      iVar7 = *index + 1;
      *index = iVar7;
      this_00 = (this->propertyMap).ptr;
      iVar2 = this_00->count - this_00->freeCount;
      bVar6 = iVar7 < iVar2;
    } while (iVar7 < iVar2);
  }
  return bVar6;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::NextLetConstGlobal(int& index, RootObjectBase* instance, const PropertyRecord** propertyRecord, Var* value, bool* isConst)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        for (; index < propertyMap->Count(); index++)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor = propertyMap->GetValueAt(index);

            if (descriptor.Attributes & PropertyLetConstGlobal)
            {
                *propertyRecord = TMapKey_ConvertKey<const PropertyRecord*>(scriptContext, propertyMap->GetKeyAt(index));
                *value = instance->GetSlot(descriptor.propertyIndex);
                *isConst = (descriptor.Attributes & PropertyConst) != 0;

                index += 1;

                return true;
            }
        }

        return false;
    }